

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSetBgColor(ImGuiTableBgTarget target,ImU32 color,int column_n)

{
  float *pfVar1;
  ImGuiTable *pIVar2;
  ImGuiTableCellData *pIVar3;
  int in_EDX;
  ImU32 in_ESI;
  int in_EDI;
  int bg_idx;
  ImGuiTableCellData *cell_data;
  ImGuiTable *table;
  ImGuiContext *g;
  int local_c;
  ImU32 local_8;
  
  pIVar2 = GImGui->CurrentTable;
  local_8 = in_ESI;
  if (in_ESI == 0x1000000) {
    local_8 = 0;
  }
  if (in_EDI - 1U < 2) {
    pfVar1 = &(pIVar2->InnerClipRect).Max.y;
    if (pIVar2->RowPosY1 < *pfVar1 || pIVar2->RowPosY1 == *pfVar1) {
      pIVar2->RowBgColor[(int)(uint)(in_EDI == 2)] = local_8;
    }
  }
  else if ((in_EDI == 3) &&
          (pfVar1 = &(pIVar2->InnerClipRect).Max.y,
          pIVar2->RowPosY1 < *pfVar1 || pIVar2->RowPosY1 == *pfVar1)) {
    local_c = in_EDX;
    if (in_EDX == -1) {
      local_c = pIVar2->CurrentColumn;
    }
    if ((pIVar2->VisibleMaskByIndex[local_c >> 5] & 1 << ((byte)local_c & 0x1f)) != 0) {
      if ((pIVar2->RowCellDataCurrent < 0) ||
         (pIVar3 = ImSpan<ImGuiTableCellData>::operator[]
                             (&pIVar2->RowCellData,(int)pIVar2->RowCellDataCurrent),
         pIVar3->Column != local_c)) {
        pIVar2->RowCellDataCurrent = pIVar2->RowCellDataCurrent + 1;
      }
      pIVar3 = ImSpan<ImGuiTableCellData>::operator[]
                         (&pIVar2->RowCellData,(int)pIVar2->RowCellDataCurrent);
      pIVar3->BgColor = local_8;
      pIVar3->Column = (ImGuiTableColumnIdx)local_c;
    }
  }
  return;
}

Assistant:

void ImGui::TableSetBgColor(ImGuiTableBgTarget target, ImU32 color, int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(target != ImGuiTableBgTarget_None);

    if (color == IM_COL32_DISABLE)
        color = 0;

    // We cannot draw neither the cell or row background immediately as we don't know the row height at this point in time.
    switch (target)
    {
    case ImGuiTableBgTarget_CellBg:
    {
        if (table->RowPosY1 > table->InnerClipRect.Max.y) // Discard
            return;
        if (column_n == -1)
            column_n = table->CurrentColumn;
        if (!IM_BITARRAY_TESTBIT(table->VisibleMaskByIndex, column_n))
            return;
        if (table->RowCellDataCurrent < 0 || table->RowCellData[table->RowCellDataCurrent].Column != column_n)
            table->RowCellDataCurrent++;
        ImGuiTableCellData* cell_data = &table->RowCellData[table->RowCellDataCurrent];
        cell_data->BgColor = color;
        cell_data->Column = (ImGuiTableColumnIdx)column_n;
        break;
    }
    case ImGuiTableBgTarget_RowBg0:
    case ImGuiTableBgTarget_RowBg1:
    {
        if (table->RowPosY1 > table->InnerClipRect.Max.y) // Discard
            return;
        IM_ASSERT(column_n == -1);
        int bg_idx = (target == ImGuiTableBgTarget_RowBg1) ? 1 : 0;
        table->RowBgColor[bg_idx] = color;
        break;
    }
    default:
        IM_ASSERT(0);
    }
}